

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchncnn.cpp
# Opt level: O0

void benchmark(char *comment,Mat *_in,Option *opt)

{
  vector<const_char_*,_std::allocator<const_char_*>_> *this;
  Mat *this_00;
  double *pdVar1;
  undefined4 *in_RDX;
  undefined8 in_RDI;
  double time;
  double end;
  Extractor ex_1;
  double start;
  int i_1;
  double time_avg;
  double time_max;
  double time_min;
  Extractor ex;
  int i;
  Mat out;
  vector<const_char_*,_std::allocator<const_char_*>_> *output_names;
  vector<const_char_*,_std::allocator<const_char_*>_> *input_names;
  DataReaderFromEmpty dr;
  char parampath [256];
  Net net;
  Mat in;
  Mat *in_stack_fffffffffffffd28;
  Net *in_stack_fffffffffffffd30;
  Net *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  Net *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd54;
  Mat *in_00;
  vector<const_char_*,_std::allocator<const_char_*>_> *blob_name;
  Extractor *this_01;
  double local_288;
  Net *local_280;
  double local_268;
  int local_25c;
  double local_258;
  double local_250;
  _func_int **local_248 [3];
  int local_22c;
  DataReader *in_stack_fffffffffffffdf0;
  Net *in_stack_fffffffffffffdf8;
  Extractor local_1c8 [16];
  Net local_c0 [2];
  undefined4 *local_18;
  undefined8 local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  ncnn::Mat::Mat((Mat *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  ncnn::Mat::fill((Mat *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                  (float)((ulong)in_stack_fffffffffffffd38 >> 0x20));
  ncnn::UnlockedPoolAllocator::clear
            ((UnlockedPoolAllocator *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40))
  ;
  ncnn::PoolAllocator::clear
            ((PoolAllocator *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  ncnn::Net::Net((Net *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  local_c0[0].opt._0_4_ = *local_18;
  local_c0[0].opt.num_threads = local_18[1];
  local_c0[0].opt.blob_allocator._0_4_ = local_18[2];
  local_c0[0].opt.blob_allocator._4_4_ = local_18[3];
  local_c0[0].opt.workspace_allocator._0_4_ = local_18[4];
  local_c0[0].opt.workspace_allocator._4_4_ = local_18[5];
  local_c0[0].opt.openmp_blocktime = local_18[6];
  local_c0[0].opt._28_4_ = local_18[7];
  local_c0[0].opt._32_4_ = local_18[8];
  local_c0[0].opt._36_4_ = local_18[9];
  local_c0[0].opt._40_4_ = local_18[10];
  local_c0[0].opt._44_4_ = local_18[0xb];
  local_c0[0].opt.flush_denormals = local_18[0xc];
  local_c0[0].opt._52_4_ = local_18[0xd];
  local_c0[0].opt._56_4_ = local_18[0xe];
  local_c0[0].opt._60_4_ = local_18[0xf];
  this_01 = local_1c8;
  sprintf((char *)this_01,"%s.param",local_8);
  ncnn::Net::load_param
            (in_stack_fffffffffffffd48,
             (char *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  DataReaderFromEmpty::DataReaderFromEmpty((DataReaderFromEmpty *)in_stack_fffffffffffffd30);
  ncnn::Net::load_model(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  this = ncnn::Net::input_names(local_c0);
  blob_name = this;
  this_00 = (Mat *)ncnn::Net::output_names(local_c0);
  in_00 = this_00;
  if ((g_enable_cooling_down & 1U) != 0) {
    sleep(10);
  }
  ncnn::Mat::Mat((Mat *)&stack0xfffffffffffffdd8);
  for (local_22c = 0; local_22c < g_warmup_loop_count; local_22c = local_22c + 1) {
    ncnn::Net::create_extractor(in_stack_fffffffffffffd38);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](this,0);
    ncnn::Extractor::input(this_01,(char *)blob_name,in_00);
    in_stack_fffffffffffffd54 = 0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)this_00,0);
    ncnn::Extractor::extract(this_01,(char *)blob_name,in_00,in_stack_fffffffffffffd54);
    ncnn::Extractor::~Extractor((Extractor *)in_stack_fffffffffffffd30);
  }
  local_248[0] = (_func_int **)0x7fefffffffffffff;
  local_250 = -1.79769313486232e+308;
  local_258 = 0.0;
  for (local_25c = 0; local_25c < g_loop_count; local_25c = local_25c + 1) {
    local_268 = ncnn::get_current_time();
    ncnn::Net::create_extractor(in_stack_fffffffffffffd38);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](this,0);
    ncnn::Extractor::input(this_01,(char *)blob_name,in_00);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)this_00,0);
    ncnn::Extractor::extract(this_01,(char *)blob_name,in_00,in_stack_fffffffffffffd54);
    ncnn::Extractor::~Extractor((Extractor *)in_stack_fffffffffffffd30);
    in_stack_fffffffffffffd38 = (Net *)ncnn::get_current_time();
    local_288 = (double)in_stack_fffffffffffffd38 - local_268;
    local_280 = in_stack_fffffffffffffd38;
    in_stack_fffffffffffffd30 = (Net *)std::min<double>((double *)local_248,&local_288);
    local_248[0] = in_stack_fffffffffffffd30->_vptr_Net;
    pdVar1 = std::max<double>(&local_250,&local_288);
    local_250 = *pdVar1;
    local_258 = local_288 + local_258;
  }
  local_258 = local_258 / (double)g_loop_count;
  fprintf(_stderr,"%20s  min = %7.2f  max = %7.2f  avg = %7.2f\n",(int)local_248[0],
          SUB84(local_250,0),SUB84(local_258,0),local_8);
  ncnn::Mat::~Mat((Mat *)0x13fbdd);
  DataReaderFromEmpty::~DataReaderFromEmpty((DataReaderFromEmpty *)0x13fbea);
  ncnn::Net::~Net(in_stack_fffffffffffffd30);
  ncnn::Mat::~Mat((Mat *)0x13fc04);
  return;
}

Assistant:

void benchmark(const char* comment, const ncnn::Mat& _in, const ncnn::Option& opt)
{
    ncnn::Mat in = _in;
    in.fill(0.01f);

    g_blob_pool_allocator.clear();
    g_workspace_pool_allocator.clear();

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        g_blob_vkallocator->clear();
        g_staging_vkallocator->clear();
    }
#endif // NCNN_VULKAN

    ncnn::Net net;

    net.opt = opt;

#if NCNN_VULKAN
    if (net.opt.use_vulkan_compute)
    {
        net.set_vulkan_device(g_vkdev);
    }
#endif // NCNN_VULKAN

#ifdef __EMSCRIPTEN__
#define MODEL_DIR "/working/"
#else
#define MODEL_DIR ""
#endif

    char parampath[256];
    sprintf(parampath, MODEL_DIR "%s.param", comment);
    net.load_param(parampath);

    DataReaderFromEmpty dr;
    net.load_model(dr);

    const std::vector<const char*>& input_names = net.input_names();
    const std::vector<const char*>& output_names = net.output_names();

    if (g_enable_cooling_down)
    {
        // sleep 10 seconds for cooling down SOC  :(
#ifdef _WIN32
        Sleep(10 * 1000);
#elif defined(__unix__) || defined(__APPLE__)
        sleep(10);
#elif _POSIX_TIMERS
        struct timespec ts;
        ts.tv_sec = 10;
        ts.tv_nsec = 0;
        nanosleep(&ts, &ts);
#else
        // TODO How to handle it ?
#endif
    }

    ncnn::Mat out;

    // warm up
    for (int i = 0; i < g_warmup_loop_count; i++)
    {
        ncnn::Extractor ex = net.create_extractor();
        ex.input(input_names[0], in);
        ex.extract(output_names[0], out);
    }

    double time_min = DBL_MAX;
    double time_max = -DBL_MAX;
    double time_avg = 0;

    for (int i = 0; i < g_loop_count; i++)
    {
        double start = ncnn::get_current_time();

        {
            ncnn::Extractor ex = net.create_extractor();
            ex.input(input_names[0], in);
            ex.extract(output_names[0], out);
        }

        double end = ncnn::get_current_time();

        double time = end - start;

        time_min = std::min(time_min, time);
        time_max = std::max(time_max, time);
        time_avg += time;
    }

    time_avg /= g_loop_count;

    fprintf(stderr, "%20s  min = %7.2f  max = %7.2f  avg = %7.2f\n", comment, time_min, time_max, time_avg);
}